

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsView::paintEvent(QGraphicsView *this,QPaintEvent *event)

{
  bool bVar1;
  uint uVar2;
  QGraphicsViewPrivate *this_00;
  QGraphicsScenePrivate *pQVar3;
  QRegion *pQVar4;
  QWidget *pQVar5;
  void *__src;
  QWidgetPrivate *pQVar6;
  ulong uVar7;
  QPaintEvent *in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QWidgetPrivate *w;
  anon_class_48_6_1c4006f9 actuallyDraw;
  bool viewTransformed;
  QPainter painter;
  QRectF exposedSceneRect;
  QGraphicsViewPrivate *d;
  QTransform viewTransform;
  OptimizationFlag in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  QPaintDevice *local_170;
  QGraphicsView *in_stack_fffffffffffffea0;
  undefined1 *local_140 [2];
  undefined1 *local_130;
  undefined1 *local_128;
  undefined1 **local_120;
  undefined8 *local_118;
  undefined1 local_10d;
  Int local_10c;
  undefined1 *local_108;
  undefined1 local_100 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  QFlagsStorageHelper<QGraphicsView::OptimizationFlag,_4> local_b4;
  undefined1 local_a8 [80];
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QGraphicsView *)0xa3ee25);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3ee41);
  if (bVar1) {
    local_b4.super_QFlagsStorage<QGraphicsView::OptimizationFlag>.i =
         (QFlagsStorage<QGraphicsView::OptimizationFlag>)
         QFlags<QGraphicsView::OptimizationFlag>::operator&
                   ((QFlags<QGraphicsView::OptimizationFlag> *)
                    CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                    in_stack_fffffffffffffe7c);
    bVar1 = QFlags<QGraphicsView::OptimizationFlag>::operator!
                      ((QFlags<QGraphicsView::OptimizationFlag> *)&local_b4);
    uVar2 = (uint)bVar1;
    QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa3eea3);
    pQVar3 = QGraphicsScene::d_func((QGraphicsScene *)0xa3eeab);
    *(uint *)&pQVar3->field_0xb8 = *(uint *)&pQVar3->field_0xb8 & 0xffffbfff | (uVar2 & 1) << 0xe;
    pQVar4 = QPaintEvent::region(in_RSI);
    QRegion::operator=(&this_00->exposedRegion,(QRegion *)pQVar4);
    local_d8 = 0xffffffffffffffff;
    local_d0 = 0xffffffffffffffff;
    local_c8 = 0xffffffffffffffff;
    local_c0 = 0xffffffffffffffff;
    local_100 = QRegion::boundingRect();
    mapToScene(in_stack_fffffffffffffea0,in_RDI);
    QPolygonF::boundingRect();
    QPolygonF::~QPolygonF((QPolygonF *)0xa3ef86);
    local_108 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar5 = QAbstractScrollArea::viewport
                       ((QAbstractScrollArea *)CONCAT44(uVar2,in_stack_fffffffffffffe80));
    local_170 = (QPaintDevice *)0x0;
    if (pQVar5 != (QWidget *)0x0) {
      local_170 = &pQVar5->super_QPaintDevice;
    }
    QPainter::QPainter((QPainter *)&local_108,local_170);
    if ((this_00->rubberBanding & 1U) != 0) {
      bVar1 = QRect::isEmpty((QRect *)CONCAT44(uVar2,in_stack_fffffffffffffe80));
      if (!bVar1) {
        QPainter::save();
      }
    }
    bVar1 = (bool)QPainter::renderHints();
    QPainter::setRenderHints((QFlags_conflict1 *)&local_108,bVar1);
    local_10c = (this_00->renderHints).super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
                super_QFlagsStorage<QPainter::RenderHint>.i;
    QPainter::setRenderHints((QFlags_conflict1 *)&local_108,SUB41(local_10c,0));
    local_10d = isTransformed((QGraphicsView *)CONCAT44(uVar2,in_stack_fffffffffffffe80));
    if ((bool)local_10d) {
      viewportTransform((QGraphicsView *)in_RDI);
      QPainter::setWorldTransform((QTransform *)&local_108,SUB81(local_58,0));
    }
    memcpy(local_a8,&DAT_00b482a8,0x50);
    __src = (void *)QPainter::worldTransform();
    memcpy(local_a8,__src,0x50);
    memset(local_140,0,0x30);
    local_140[0] = &stack0xffffffffffffff50;
    local_130 = &local_10d;
    local_128 = local_a8;
    local_120 = &local_108;
    local_118 = &local_d8;
    paintEvent::anon_class_48_6_1c4006f9::operator()((anon_class_48_6_1c4006f9 *)this_00);
    if ((this_00->stereoEnabled & 1U) != 0) {
      QAbstractScrollArea::viewport
                ((QAbstractScrollArea *)CONCAT44(uVar2,in_stack_fffffffffffffe80));
      pQVar6 = QWidgetPrivate::get((QWidget *)0xa3f1b1);
      uVar7 = (**(code **)(*(long *)pQVar6 + 0xa0))();
      if ((uVar7 & 1) != 0) {
        paintEvent::anon_class_48_6_1c4006f9::operator()((anon_class_48_6_1c4006f9 *)this_00);
        (**(code **)(*(long *)pQVar6 + 0xa0))();
      }
    }
    QPainter::end();
    QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa3f205);
    pQVar3 = QGraphicsScene::d_func((QGraphicsScene *)0xa3f20d);
    *(uint *)&pQVar3->field_0xb8 = *(uint *)&pQVar3->field_0xb8 & 0xffffbfff | 0x4000;
    QPainter::~QPainter((QPainter *)&local_108);
  }
  else {
    QAbstractScrollArea::paintEvent((QAbstractScrollArea *)in_RDI,in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsView::paintEvent(QPaintEvent *event)
{
    Q_D(QGraphicsView);
    if (!d->scene) {
        QAbstractScrollArea::paintEvent(event);
        return;
    }

    // Set up painter state protection.
    d->scene->d_func()->painterStateProtection = !(d->optimizationFlags & DontSavePainterState);

    // Determine the exposed region
    d->exposedRegion = event->region();
    QRectF exposedSceneRect = mapToScene(d->exposedRegion.boundingRect()).boundingRect();

    // Set up the painter
    QPainter painter(viewport());
#if QT_CONFIG(rubberband)
    if (d->rubberBanding && !d->rubberBandRect.isEmpty())
        painter.save();
#endif
    // Set up render hints
    painter.setRenderHints(painter.renderHints(), false);
    painter.setRenderHints(d->renderHints, true);

    // Set up viewport transform
    const bool viewTransformed = isTransformed();
    if (viewTransformed)
        painter.setWorldTransform(viewportTransform());
    const QTransform viewTransform = painter.worldTransform();

    const auto actuallyDraw = [&]() {
        // Draw background
        if (d->cacheMode & CacheBackground) {
            // Recreate the background pixmap, and flag the whole background as
            // exposed.
            if (d->mustResizeBackgroundPixmap) {
                const qreal dpr = d->viewport->devicePixelRatio();
                d->backgroundPixmap = QPixmap(viewport()->size() * dpr);
                d->backgroundPixmap.setDevicePixelRatio(dpr);
                QBrush bgBrush = viewport()->palette().brush(viewport()->backgroundRole());
                if (!bgBrush.isOpaque())
                    d->backgroundPixmap.fill(Qt::transparent);
                QPainter p(&d->backgroundPixmap);
                p.fillRect(0, 0, d->backgroundPixmap.width(), d->backgroundPixmap.height(), bgBrush);
                d->backgroundPixmapExposed = QRegion(viewport()->rect());
                d->mustResizeBackgroundPixmap = false;
            }

            // Redraw exposed areas
            if (!d->backgroundPixmapExposed.isEmpty()) {
                QPainter backgroundPainter(&d->backgroundPixmap);
                backgroundPainter.setClipRegion(d->backgroundPixmapExposed, Qt::ReplaceClip);
                if (viewTransformed)
                    backgroundPainter.setTransform(viewTransform);
                QRectF backgroundExposedSceneRect = mapToScene(d->backgroundPixmapExposed.boundingRect()).boundingRect();
                drawBackground(&backgroundPainter, backgroundExposedSceneRect);
                d->backgroundPixmapExposed = QRegion();
            }

            // Blit the background from the background pixmap
            if (viewTransformed) {
                painter.setWorldTransform(QTransform());
                painter.drawPixmap(QPoint(), d->backgroundPixmap);
                painter.setWorldTransform(viewTransform);
            } else {
                painter.drawPixmap(QPoint(), d->backgroundPixmap);
            }
        } else {
            if (!(d->optimizationFlags & DontSavePainterState))
                painter.save();

            drawBackground(&painter, exposedSceneRect);
            if (!(d->optimizationFlags & DontSavePainterState))
                painter.restore();
        }

        // Items
        if (!(d->optimizationFlags & IndirectPainting)) {
            const quint32 oldRectAdjust = d->scene->d_func()->rectAdjust;
            if (d->optimizationFlags & QGraphicsView::DontAdjustForAntialiasing)
                d->scene->d_func()->rectAdjust = 1;
            else
                d->scene->d_func()->rectAdjust = 2;
            d->scene->d_func()->drawItems(&painter, viewTransformed ? &viewTransform : nullptr,
                                          &d->exposedRegion, viewport());
            d->scene->d_func()->rectAdjust = oldRectAdjust;
            // Make sure the painter's world transform is restored correctly when
            // drawing without painter state protection (DontSavePainterState).
            // We only change the worldTransform() so there's no need to do a full-blown
            // save() and restore(). Also note that we don't have to do this in case of
            // IndirectPainting (the else branch), because in that case we always save()
            // and restore() in QGraphicsScene::drawItems().
            if (!d->scene->d_func()->painterStateProtection)
                painter.setOpacity(1.0);
            painter.setWorldTransform(viewTransform);
        } else {
            // Make sure we don't have unpolished items before we draw
            if (!d->scene->d_func()->unpolishedItems.isEmpty())
                d->scene->d_func()->_q_polishItems();
            // We reset updateAll here (after we've issued polish events)
            // so that we can discard update requests coming from polishEvent().
            d->scene->d_func()->updateAll = false;

            // Find all exposed items
            bool allItems = false;
            QList<QGraphicsItem *> itemList = d->findItems(d->exposedRegion, &allItems, viewTransform);
            if (!itemList.isEmpty()) {
                // Generate the style options.
                const int numItems = itemList.size();
                QGraphicsItem **itemArray = &itemList[0]; // Relies on QList internals, but is perfectly valid.
                QStyleOptionGraphicsItem *styleOptionArray = d->allocStyleOptionsArray(numItems);
                QTransform transform(Qt::Uninitialized);
                for (int i = 0; i < numItems; ++i) {
                    QGraphicsItem *item = itemArray[i];
                    QGraphicsItemPrivate *itemd = item->d_ptr.data();
                    itemd->initStyleOption(&styleOptionArray[i], viewTransform, d->exposedRegion, allItems);
                    // Cache the item's area in view coordinates.
                    // Note that we have to do this here in case the base class implementation
                    // (QGraphicsScene::drawItems) is not called. If it is, we'll do this
                    // operation twice, but that's the price one has to pay for using indirect
                    // painting :-/.
                    const QRectF brect = adjustedItemEffectiveBoundingRect(item);
                    if (!itemd->itemIsUntransformable()) {
                        transform = item->sceneTransform();
                        if (viewTransformed)
                            transform *= viewTransform;
                    } else {
                        transform = item->deviceTransform(viewTransform);
                    }
                    itemd->paintedViewBoundingRects.insert(d->viewport, transform.mapRect(brect).toRect());
                }
                // Draw the items.
                drawItems(&painter, numItems, itemArray, styleOptionArray);
                d->freeStyleOptionsArray(styleOptionArray);
            }
        }

        // Foreground
        drawForeground(&painter, exposedSceneRect);

    #if QT_CONFIG(rubberband)
        // Rubberband
        if (d->rubberBanding && !d->rubberBandRect.isEmpty()) {
            painter.restore();
            QStyleOptionRubberBand option;
            option.initFrom(viewport());
            option.rect = d->rubberBandRect;
            option.shape = QRubberBand::Rectangle;

            QStyleHintReturnMask mask;
            if (viewport()->style()->styleHint(QStyle::SH_RubberBand_Mask, &option, viewport(), &mask)) {
                // painter clipping for masked rubberbands
                painter.setClipRegion(mask.region, Qt::IntersectClip);
            }

            viewport()->style()->drawControl(QStyle::CE_RubberBand, &option, &painter, viewport());
        }
    #endif
    };

    actuallyDraw();

    // For stereo we want to draw everything twice, once to each buffer
    if (d->stereoEnabled) {
        QWidgetPrivate* w = QWidgetPrivate::get(viewport());
        if (w->toggleStereoTargetBuffer()) {
            actuallyDraw();
            w->toggleStereoTargetBuffer();
        }
    }

    painter.end();

    // Restore painter state protection.
    d->scene->d_func()->painterStateProtection = true;
}